

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void scale(double *A,int rows,int cols,double alpha)

{
  ulong uVar1;
  
  if (0 < rows * cols) {
    uVar1 = 0;
    do {
      A[uVar1] = A[uVar1] * alpha;
      uVar1 = uVar1 + 1;
    } while ((uint)(rows * cols) != uVar1);
  }
  return;
}

Assistant:

void scale(double *A, int rows, int cols, double alpha) {
	int N,i;
	/*
	 * A = alpha * A
	 * Matrix A is overwritten.
	 */ 
	 
	N = rows * cols;
	
	#pragma omp parallel for
	for (i = 0; i < N;++i) {
		A[i] = alpha * A[i];
	}
}